

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O3

int32_t __thiscall icu_63::ServiceEnumeration::count(ServiceEnumeration *this,UErrorCode *status)

{
  int iVar1;
  int32_t iVar2;
  
  iVar2 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = this->_timestamp;
    iVar2 = ICUService::getTimestamp(&this->_service->super_ICUService);
    if (iVar1 == iVar2) {
      iVar2 = (this->_ids).count;
    }
    else {
      *status = U_ENUM_OUT_OF_SYNC_ERROR;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

virtual int32_t count(UErrorCode& status) const {
        return upToDate(status) ? _ids.size() : 0;
    }